

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_rawset(lua_State *L,int idx)

{
  int iVar1;
  undefined4 uVar2;
  TValue *pTVar3;
  TValue *pTVar4;
  StkId pTVar5;
  
  pTVar3 = index2addr(L,idx);
  pTVar4 = luaH_set(L,(Table *)(pTVar3->value_).gc,L->top + -2);
  pTVar5 = L->top;
  iVar1 = pTVar5[-1].tt_;
  uVar2 = *(undefined4 *)&pTVar5[-1].field_0xc;
  pTVar4->value_ = pTVar5[-1].value_;
  pTVar4->tt_ = iVar1;
  *(undefined4 *)&pTVar4->field_0xc = uVar2;
  (pTVar3->value_).f[10] = (code)0x0;
  pTVar5 = L->top;
  if ((((pTVar5[-1].tt_ & 0x40) != 0) && ((((Table *)(pTVar3->value_).gc)->marked & 4) != 0)) &&
     (((pTVar5[-1].value_.gc)->marked & 3) != 0)) {
    luaC_barrierback_(L,(Table *)(pTVar3->value_).gc);
    pTVar5 = L->top;
  }
  L->top = pTVar5 + -2;
  return;
}

Assistant:

LUA_API void lua_rawset(lua_State *L, int idx) {
    StkId o;
    TValue *slot;
    lua_lock(L);
    api_checknelems(L, 2);
    o = index2addr(L, idx);
    api_check(L, ttistable(o), "table expected");
    slot = luaH_set(L, hvalue(o), L->top - 2);
    setobj2t(L, slot, L->top - 1);
    invalidateTMcache(hvalue(o));
    luaC_barrierback(L, hvalue(o), L->top - 1);
    L->top -= 2;
    lua_unlock(L);
}